

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

_class * class_new64(t_symbol *s,t_newmethod newmethod,t_method freemethod,size_t size,int flags,
                    t_atomtype type1,...)

{
  if (s == (t_symbol *)0x0) {
    logpost((void *)0x0,3,"refusing to load unnamed %dbit-float object into %dbit-float Pd",0x40,
            0x20,_type1);
  }
  else {
    logpost((void *)0x0,(uint)class_new64_loglevel * 3,
            "refusing to load %dbit-float object \'%s\' into %dbit-float Pd",0x40,s->s_name,0x20);
    class_new64_loglevel = 1;
  }
  return (_class *)0x0;
}

Assistant:

class_new64
#else
  class_new
#endif
   (t_symbol *s, t_newmethod newmethod, t_method freemethod,
    size_t size, int flags, t_atomtype type1, ...)
{
    const int ext_floatsize =
#if PD_FLOATSIZE == 32
        64
#else
        32
#endif
        ;
    static int loglevel = 0;
    if(s) {
        logpost(0, loglevel, "refusing to load %dbit-float object '%s' into %dbit-float Pd", ext_floatsize, s->s_name, PD_FLOATSIZE);
        loglevel=3;
    } else
        logpost(0, 3, "refusing to load unnamed %dbit-float object into %dbit-float Pd", ext_floatsize, PD_FLOATSIZE);

    return 0;
}